

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

TWIN_MESSENGER_HANDLE twin_messenger_create(TWIN_MESSENGER_CONFIG *messenger_config)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  SINGLYLINKEDLIST_HANDLE pSVar3;
  MAP_HANDLE properties;
  AMQP_MESSENGER_HANDLE pAVar4;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  AMQP_MESSENGER_CONFIG amqp_msgr_config;
  LOGGER_LOG l_8;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  MAP_HANDLE link_attach_properties;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  TWIN_MESSENGER_CONFIG *messenger_config_local;
  
  if (messenger_config == (TWIN_MESSENGER_CONFIG *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_create",0x677,1,"Invalid argument (messenger_config is NULL)");
    }
    l = (LOGGER_LOG)0x0;
  }
  else if (((messenger_config->device_id == (char *)0x0) ||
           (messenger_config->iothub_host_fqdn == (char *)0x0)) ||
          (messenger_config->prod_info_cb == (pfTransport_GetOption_Product_Info_Callback)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_create",0x67d,1,
                "Invalid argument (device_id=%p, iothub_host_fqdn=%p, client_version=%p)",
                messenger_config->device_id,messenger_config->iothub_host_fqdn,
                messenger_config->prod_info_cb);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)malloc(0x80);
    if ((TWIN_MESSENGER_INSTANCE_conflict *)l == (TWIN_MESSENGER_INSTANCE_conflict *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"twin_messenger_create",0x684,1,"Failed allocating TWIN_MESSENGER_INSTANCE (%s)",
                  messenger_config->device_id);
      }
    }
    else {
      memset(l,0,0x80);
      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->state = TWIN_MESSENGER_STATE_STOPPED;
      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->subscription_state =
           TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->amqp_msgr_state = AMQP_MESSENGER_STATE_STOPPED;
      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_cb = messenger_config->prod_info_cb;
      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_ctx = messenger_config->prod_info_ctx;
      iVar1 = mallocAndStrcpy_s(&((TWIN_MESSENGER_INSTANCE_conflict *)l)->device_id,
                                messenger_config->device_id);
      if (iVar1 == 0) {
        if ((messenger_config->module_id == (char *)0x0) ||
           (iVar1 = mallocAndStrcpy_s(&((TWIN_MESSENGER_INSTANCE_conflict *)l)->module_id,
                                      messenger_config->module_id), iVar1 == 0)) {
          iVar1 = mallocAndStrcpy_s(&((TWIN_MESSENGER_INSTANCE_conflict *)l)->iothub_host_fqdn,
                                    messenger_config->iothub_host_fqdn);
          if (iVar1 == 0) {
            pSVar3 = singlylinkedlist_create();
            ((TWIN_MESSENGER_INSTANCE_conflict *)l)->pending_patches = pSVar3;
            if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"twin_messenger_create",0x6a6,1,
                          "Failed creating list for queueing patches (%s)",
                          messenger_config->device_id);
              }
              internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
              l = (LOGGER_LOG)0x0;
            }
            else {
              pSVar3 = singlylinkedlist_create();
              ((TWIN_MESSENGER_INSTANCE_conflict *)l)->operations = pSVar3;
              if (pSVar3 == (SINGLYLINKEDLIST_HANDLE)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                            ,"twin_messenger_create",0x6ac,1,
                            "Failed creating list for operations (%s)",messenger_config->device_id);
                }
                internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
                l = (LOGGER_LOG)0x0;
              }
              else {
                properties = create_link_attach_properties((TWIN_MESSENGER_INSTANCE_conflict *)l);
                if (properties == (MAP_HANDLE)0x0) {
                  amqp_msgr_config.prod_info_ctx = xlogging_get_log_function();
                  if ((LOGGER_LOG)amqp_msgr_config.prod_info_ctx != (LOGGER_LOG)0x0) {
                    (*(code *)amqp_msgr_config.prod_info_ctx)
                              (AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                               ,"twin_messenger_create",0x6b2,1,
                               "Failed creating link attach properties (%s)",
                               messenger_config->device_id);
                  }
                  internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
                  l = (LOGGER_LOG)0x0;
                }
                else {
                  ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_cb =
                       messenger_config->prod_info_cb;
                  ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_ctx =
                       messenger_config->prod_info_ctx;
                  amqp_msgr_config.on_subscription_changed_context =
                       ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_cb;
                  amqp_msgr_config.prod_info_cb =
                       (pfTransport_GetOption_Product_Info_Callback)
                       ((TWIN_MESSENGER_INSTANCE_conflict *)l)->prod_info_ctx;
                  l_9 = (LOGGER_LOG)((TWIN_MESSENGER_INSTANCE_conflict *)l)->device_id;
                  amqp_msgr_config.device_id = ((TWIN_MESSENGER_INSTANCE_conflict *)l)->module_id;
                  amqp_msgr_config.module_id =
                       ((TWIN_MESSENGER_INSTANCE_conflict *)l)->iothub_host_fqdn;
                  amqp_msgr_config.send_link.source_suffix = DEFAULT_TWIN_SEND_LINK_SOURCE_NAME;
                  amqp_msgr_config.send_link.target_suffix._1_1_ = 1;
                  amqp_msgr_config.send_link.target_suffix._0_1_ = 0;
                  amqp_msgr_config.send_link.attach_properties =
                       (MAP_HANDLE)DEFAULT_TWIN_RECEIVE_LINK_TARGET_NAME;
                  amqp_msgr_config.receive_link.target_suffix._1_1_ = 1;
                  amqp_msgr_config.receive_link.target_suffix._0_1_ = 0;
                  amqp_msgr_config.receive_link.attach_properties =
                       (MAP_HANDLE)on_amqp_messenger_state_changed_callback;
                  amqp_msgr_config.on_state_changed_context =
                       on_amqp_messenger_subscription_changed_callback;
                  amqp_msgr_config.send_link._16_8_ = properties;
                  amqp_msgr_config.receive_link._16_8_ = properties;
                  amqp_msgr_config.on_state_changed_callback =
                       (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)l;
                  amqp_msgr_config.on_subscription_changed_callback =
                       (AMQP_MESSENGER_SUBSCRIPTION_CALLBACK)l;
                  pAVar4 = amqp_messenger_create((AMQP_MESSENGER_CONFIG *)&l_9);
                  ((TWIN_MESSENGER_INSTANCE_conflict *)l)->amqp_msgr = pAVar4;
                  if (pAVar4 == (AMQP_MESSENGER_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                                ,"twin_messenger_create",0x6d0,1,
                                "Failed creating the AMQP messenger (%s)",
                                messenger_config->device_id);
                    }
                    internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
                    l = (LOGGER_LOG)0x0;
                  }
                  else {
                    iVar1 = amqp_messenger_subscribe_for_messages
                                      (((TWIN_MESSENGER_INSTANCE_conflict *)l)->amqp_msgr,
                                       on_amqp_message_received_callback,l);
                    if (iVar1 == 0) {
                      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->on_state_changed_callback =
                           messenger_config->on_state_changed_callback;
                      ((TWIN_MESSENGER_INSTANCE_conflict *)l)->on_state_changed_context =
                           messenger_config->on_state_changed_context;
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                                  ,"twin_messenger_create",0x6d6,1,
                                  "Failed subscribing for AMQP messages (%s)",
                                  messenger_config->device_id);
                      }
                      internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
                      l = (LOGGER_LOG)0x0;
                    }
                  }
                  destroy_link_attach_properties(properties);
                }
              }
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"twin_messenger_create",0x6a0,1,"Failed copying iothub_host_fqdn (%s)",
                        messenger_config->device_id);
            }
            internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
            l = (LOGGER_LOG)0x0;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"twin_messenger_create",0x69a,1,"Failed copying module_id (%s)",
                      messenger_config->device_id);
          }
          internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
          l = (LOGGER_LOG)0x0;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"twin_messenger_create",0x694,1,"Failed copying device_id (%s)",
                    messenger_config->device_id);
        }
        internal_twin_messenger_destroy((TWIN_MESSENGER_INSTANCE_conflict *)l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (TWIN_MESSENGER_HANDLE)l;
}

Assistant:

TWIN_MESSENGER_HANDLE twin_messenger_create(const TWIN_MESSENGER_CONFIG* messenger_config)
{
    TWIN_MESSENGER_INSTANCE* twin_msgr;

    if (messenger_config == NULL)
    {
        LogError("Invalid argument (messenger_config is NULL)");
        twin_msgr = NULL;
    }
    else if (messenger_config->device_id == NULL || messenger_config->iothub_host_fqdn == NULL || messenger_config->prod_info_cb == NULL)
    {
        LogError("Invalid argument (device_id=%p, iothub_host_fqdn=%p, client_version=%p)",
            messenger_config->device_id, messenger_config->iothub_host_fqdn, messenger_config->prod_info_cb);
        twin_msgr = NULL;
    }
    else
    {
        if ((twin_msgr = (TWIN_MESSENGER_INSTANCE*)malloc(sizeof(TWIN_MESSENGER_INSTANCE))) == NULL)
        {
            LogError("Failed allocating TWIN_MESSENGER_INSTANCE (%s)", messenger_config->device_id);
        }
        else
        {
            MAP_HANDLE link_attach_properties;

            memset(twin_msgr, 0, sizeof(TWIN_MESSENGER_INSTANCE));
            twin_msgr->state = TWIN_MESSENGER_STATE_STOPPED;
            twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
            twin_msgr->amqp_msgr_state = AMQP_MESSENGER_STATE_STOPPED;

            twin_msgr->prod_info_cb = messenger_config->prod_info_cb;
            twin_msgr->prod_info_ctx = messenger_config->prod_info_ctx;

            if (mallocAndStrcpy_s(&twin_msgr->device_id, messenger_config->device_id) != 0)
            {
                LogError("Failed copying device_id (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((messenger_config->module_id != NULL) && (mallocAndStrcpy_s(&twin_msgr->module_id, messenger_config->module_id) != 0))
            {
                LogError("Failed copying module_id (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if (mallocAndStrcpy_s(&twin_msgr->iothub_host_fqdn, messenger_config->iothub_host_fqdn) != 0)
            {
                LogError("Failed copying iothub_host_fqdn (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((twin_msgr->pending_patches = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating list for queueing patches (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((twin_msgr->operations = singlylinkedlist_create()) == NULL)
            {
                LogError("Failed creating list for operations (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else if ((link_attach_properties = create_link_attach_properties(twin_msgr)) == NULL)
            {
                LogError("Failed creating link attach properties (%s)", messenger_config->device_id);
                internal_twin_messenger_destroy(twin_msgr);
                twin_msgr = NULL;
            }
            else
            {
                twin_msgr->prod_info_cb = messenger_config->prod_info_cb;
                twin_msgr->prod_info_ctx = messenger_config->prod_info_ctx;

                AMQP_MESSENGER_CONFIG amqp_msgr_config;
                amqp_msgr_config.prod_info_cb = twin_msgr->prod_info_cb;
                amqp_msgr_config.prod_info_ctx = twin_msgr->prod_info_ctx;
                amqp_msgr_config.device_id = twin_msgr->device_id;
                amqp_msgr_config.module_id = twin_msgr->module_id;
                amqp_msgr_config.iothub_host_fqdn = twin_msgr->iothub_host_fqdn;
                amqp_msgr_config.send_link.target_suffix = DEFAULT_TWIN_SEND_LINK_SOURCE_NAME;
                amqp_msgr_config.send_link.attach_properties = link_attach_properties;
                amqp_msgr_config.send_link.snd_settle_mode = sender_settle_mode_settled;
                amqp_msgr_config.send_link.rcv_settle_mode = receiver_settle_mode_first;
                amqp_msgr_config.receive_link.source_suffix = DEFAULT_TWIN_RECEIVE_LINK_TARGET_NAME;
                amqp_msgr_config.receive_link.attach_properties = link_attach_properties;
                amqp_msgr_config.receive_link.snd_settle_mode = sender_settle_mode_settled;
                amqp_msgr_config.receive_link.rcv_settle_mode = receiver_settle_mode_first;
                amqp_msgr_config.on_state_changed_callback = on_amqp_messenger_state_changed_callback;
                amqp_msgr_config.on_state_changed_context = (void*)twin_msgr;
                amqp_msgr_config.on_subscription_changed_callback = on_amqp_messenger_subscription_changed_callback;
                amqp_msgr_config.on_subscription_changed_context = (void*)twin_msgr;

                if ((twin_msgr->amqp_msgr = amqp_messenger_create(&amqp_msgr_config)) == NULL)
                {
                    LogError("Failed creating the AMQP messenger (%s)", messenger_config->device_id);
                    internal_twin_messenger_destroy(twin_msgr);
                    twin_msgr = NULL;
                }
                else if (amqp_messenger_subscribe_for_messages(twin_msgr->amqp_msgr, on_amqp_message_received_callback, (void*)twin_msgr))
                {
                    LogError("Failed subscribing for AMQP messages (%s)", messenger_config->device_id);
                    internal_twin_messenger_destroy(twin_msgr);
                    twin_msgr = NULL;
                }
                else
                {
                    twin_msgr->on_state_changed_callback = messenger_config->on_state_changed_callback;

                    twin_msgr->on_state_changed_context = messenger_config->on_state_changed_context;
                }

                destroy_link_attach_properties(link_attach_properties);
            }
        }
    }

    return (TWIN_MESSENGER_HANDLE)twin_msgr;
}